

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmd.c
# Opt level: O3

int slu_mmdelm_(int_t *mdnode,int_t *xadj,shortint *adjncy,shortint *dhead,int *dforw,int *dbakw,
               shortint *qsize,shortint *llist,shortint *marker,int_t *maxint,int_t *tag)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  shortint *psVar6;
  int iVar7;
  uint uVar8;
  int_t iVar9;
  long lVar10;
  shortint *psVar11;
  int iVar12;
  int iVar13;
  
  psVar11 = dforw + -1;
  marker[(long)*mdnode + -1] = *tag;
  iVar12 = xadj[(long)*mdnode + -1];
  iVar3 = xadj[*mdnode];
  iVar7 = iVar3 + -1;
  iVar13 = iVar3 - iVar12;
  if (iVar12 < iVar3) {
    lVar4 = (long)iVar12;
    lVar5 = 0;
    uVar8 = 0;
    do {
      uVar1 = adjncy[lVar4 + lVar5 + -1];
      lVar10 = (long)(int)uVar1;
      if (lVar10 == 0) break;
      if (marker[lVar10 + -1] < *tag) {
        marker[lVar10 + -1] = *tag;
        if (psVar11[lVar10] < 0) {
          llist[lVar10 + -1] = uVar8;
          uVar8 = uVar1;
        }
        else {
          adjncy[(long)iVar12 + -1] = uVar1;
          iVar12 = iVar12 + 1;
        }
      }
      lVar5 = lVar5 + 1;
    } while (iVar13 != (int)lVar5);
    for (; 0 < (int)uVar8; uVar8 = llist[(ulong)uVar8 - 1]) {
      adjncy[(long)iVar7 + -1] = -uVar8;
      iVar9 = xadj[uVar8];
      for (iVar3 = xadj[(ulong)uVar8 - 1]; iVar3 < iVar9; iVar3 = xadj[(ulong)(uint)-iVar3 - 1]) {
        lVar4 = (long)iVar3;
        while( true ) {
          iVar3 = adjncy[lVar4 + -1];
          lVar5 = (long)iVar3;
          if (lVar5 < 0) break;
          if (iVar3 == 0) goto LAB_0010e413;
          if ((marker[lVar5 + -1] < *tag) && (-1 < psVar11[lVar5])) {
            marker[lVar5 + -1] = *tag;
            for (; iVar7 <= iVar12; iVar7 = xadj[(long)(1 - adjncy[(long)iVar7 + -1]) + -1] + -1) {
              iVar12 = xadj[-1 - (long)adjncy[(long)iVar7 + -1]];
            }
            adjncy[(long)iVar12 + -1] = iVar3;
            iVar12 = iVar12 + 1;
          }
          lVar4 = lVar4 + 1;
          if (iVar9 <= lVar4) goto LAB_0010e413;
        }
        iVar9 = xadj[(uint)-iVar3];
      }
LAB_0010e413:
    }
  }
  if (iVar12 <= iVar7) {
    adjncy[(long)iVar12 + -1] = 0;
  }
  iVar7 = xadj[(long)*mdnode + -1];
  iVar12 = xadj[*mdnode];
  if (iVar7 < iVar12) {
    do {
      lVar4 = (long)iVar7;
      while( true ) {
        iVar3 = adjncy[lVar4 + -1];
        lVar5 = (long)iVar3;
        if (lVar5 < 0) break;
        if (iVar3 == 0) {
          return 0;
        }
        uVar8 = dbakw[lVar5 + -1];
        if ((uVar8 != 0) && (*maxint + uVar8 != 0)) {
          iVar7 = psVar11[lVar5];
          if (0 < (long)iVar7) {
            dbakw[(long)iVar7 + -1] = uVar8;
          }
          uVar1 = -uVar8;
          if (0 < (int)uVar8) {
            uVar1 = uVar8;
          }
          psVar6 = dhead + -1;
          if (0 < (int)uVar8) {
            psVar6 = psVar11;
          }
          psVar6[uVar1] = iVar7;
        }
        iVar7 = xadj[lVar5 + -1];
        iVar3 = xadj[lVar5];
        iVar13 = iVar7;
        if (iVar7 < iVar3) {
          lVar10 = 0;
          do {
            iVar2 = adjncy[(long)iVar7 + lVar10 + -1];
            if ((long)iVar2 == 0) break;
            if (marker[(long)iVar2 + -1] < *tag) {
              adjncy[(long)iVar13 + -1] = iVar2;
              iVar13 = iVar13 + 1;
            }
            lVar10 = lVar10 + 1;
          } while (iVar3 - iVar7 != (int)lVar10);
        }
        if (iVar13 - iVar7 == 0 || iVar13 < iVar7) {
          qsize[(long)*mdnode + -1] = qsize[(long)*mdnode + -1] + qsize[lVar5 + -1];
          qsize[lVar5 + -1] = 0;
          marker[lVar5 + -1] = *maxint;
          psVar11[lVar5] = -*mdnode;
          dbakw[lVar5 + -1] = -*maxint;
        }
        else {
          psVar11[lVar5] = (iVar13 - iVar7) + 1;
          dbakw[lVar5 + -1] = 0;
          adjncy[(long)iVar13 + -1] = *mdnode;
          if (iVar13 < iVar3 + -1) {
            adjncy[iVar13] = 0;
          }
        }
        lVar4 = lVar4 + 1;
        if (iVar12 <= lVar4) {
          return 0;
        }
      }
      iVar7 = xadj[(ulong)(uint)-iVar3 - 1];
      iVar12 = xadj[(uint)-iVar3];
    } while (iVar7 < iVar12);
  }
  return 0;
}

Assistant:

int slu_mmdelm_(const int_t *mdnode, int_t *xadj, shortint *adjncy,
                shortint *dhead, int *dforw, int *dbakw, shortint *qsize,
                shortint *llist, shortint *marker, const int_t *maxint, const int_t *tag)
{
    /* System generated locals */
    int_t i__1, i__2;

    /* Local variables */
    int_t node, link, rloc, rlmt, i, j, nabor, rnode, elmnt, xqnbr, 
	istop, jstop, istrt, jstrt, nxnode, pvnode, nqnbrs, npv;


/* *************************************************************** */


/* *************************************************************** */

/*        ----------------------------------------------- */
/*        FIND REACHABLE SET AND PLACE IN DATA STRUCTURE. */
/*        ----------------------------------------------- */
    /* Parameter adjustments */
    --marker;
    --llist;
    --qsize;
    --dbakw;
    --dforw;
    --dhead;
    --adjncy;
    --xadj;

    /* Function Body */
    marker[*mdnode] = *tag;
    istrt = xadj[*mdnode];
    istop = xadj[*mdnode + 1] - 1;
/*        ------------------------------------------------------- */
/*        ELMNT POINTS TO THE BEGINNING OF THE LIST OF ELIMINATED */
/*        NABORS OF MDNODE, AND RLOC GIVES THE STORAGE LOCATION */
/*        FOR THE NEXT REACHABLE NODE. */
/*        ------------------------------------------------------- */
    elmnt = 0;
    rloc = istrt;
    rlmt = istop;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
	nabor = adjncy[i];
	if (nabor == 0) {
	    goto L300;
	}
	if (marker[nabor] >= *tag) {
	    goto L200;
	}
	marker[nabor] = *tag;
	if (dforw[nabor] < 0) {
	    goto L100;
	}
	adjncy[rloc] = nabor;
	++rloc;
	goto L200;
L100:
	llist[nabor] = elmnt;
	elmnt = nabor;
L200:
	;
    }
L300:
/*            ----------------------------------------------------- */
/*            MERGE WITH REACHABLE NODES FROM GENERALIZED ELEMENTS. */
/*            ----------------------------------------------------- */
    if (elmnt <= 0) {
	goto L1000;
    }
    adjncy[rlmt] = -elmnt;
    link = elmnt;
L400:
    jstrt = xadj[link];
    jstop = xadj[link + 1] - 1;
    i__1 = jstop;
    for (j = jstrt; j <= i__1; ++j) {
	node = adjncy[j];
	link = -node;
	if (node < 0) {
	    goto L400;
	} else if (node == 0) {
	    goto L900;
	} else {
	    goto L500;
	}
L500:
	if (marker[node] >= *tag || dforw[node] < 0) {
	    goto L800;
	}
	marker[node] = *tag;
/*                            --------------------------------- */
/*                            USE STORAGE FROM ELIMINATED NODES */
/*                            IF NECESSARY. */
/*                            --------------------------------- */
L600:
	if (rloc < rlmt) {
	    goto L700;
	}
	link = -adjncy[rlmt];
	rloc = xadj[link];
	rlmt = xadj[link + 1] - 1;
	goto L600;
L700:
	adjncy[rloc] = node;
	++rloc;
L800:
	;
    }
L900:
    elmnt = llist[elmnt];
    goto L300;
L1000:
    if (rloc <= rlmt) {
	adjncy[rloc] = 0;
    }
/*        -------------------------------------------------------- */
/*        FOR EACH NODE IN THE REACHABLE SET, DO THE FOLLOWING ... */
/*        -------------------------------------------------------- */
    link = *mdnode;
L1100:
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
	rnode = adjncy[i];
	link = -rnode;
	if (rnode < 0) {
	    goto L1100;
	} else if (rnode == 0) {
	    goto L1800;
	} else {
	    goto L1200;
	}
L1200:
/*                -------------------------------------------- */
/*                IF RNODE IS IN THE DEGREE LIST STRUCTURE ... */
/*                -------------------------------------------- */
	pvnode = dbakw[rnode];
	if (pvnode == 0 || pvnode == -(*maxint)) {
	    goto L1300;
	}
/*                    ------------------------------------- */
/*                    THEN REMOVE RNODE FROM THE STRUCTURE. */
/*                    ------------------------------------- */
	nxnode = dforw[rnode];
	if (nxnode > 0) {
	    dbakw[nxnode] = pvnode;
	}
	if (pvnode > 0) {
	    dforw[pvnode] = nxnode;
	}
	npv = -pvnode;
	if (pvnode < 0) {
	    dhead[npv] = nxnode;
	}
L1300:
/*                ---------------------------------------- */
/*                PURGE INACTIVE QUOTIENT NABORS OF RNODE. */
/*                ---------------------------------------- */
	jstrt = xadj[rnode];
	jstop = xadj[rnode + 1] - 1;
	xqnbr = jstrt;
	i__2 = jstop;
	for (j = jstrt; j <= i__2; ++j) {
	    nabor = adjncy[j];
	    if (nabor == 0) {
		goto L1500;
	    }
	    if (marker[nabor] >= *tag) {
		goto L1400;
	    }
	    adjncy[xqnbr] = nabor;
	    ++xqnbr;
L1400:
	    ;
	}
L1500:
/*                ---------------------------------------- */
/*                IF NO ACTIVE NABOR AFTER THE PURGING ... */
/*                ---------------------------------------- */
	nqnbrs = xqnbr - jstrt;
	if (nqnbrs > 0) {
	    goto L1600;
	}
/*                    ----------------------------- */
/*                    THEN MERGE RNODE WITH MDNODE. */
/*                    ----------------------------- */
	qsize[*mdnode] += qsize[rnode];
	qsize[rnode] = 0;
	marker[rnode] = *maxint;
	dforw[rnode] = -(*mdnode);
	dbakw[rnode] = -(*maxint);
	goto L1700;
L1600:
/*                -------------------------------------- */
/*                ELSE FLAG RNODE FOR DEGREE UPDATE, AND */
/*                ADD MDNODE AS A NABOR OF RNODE. */
/*                -------------------------------------- */
	dforw[rnode] = nqnbrs + 1;
	dbakw[rnode] = 0;
	adjncy[xqnbr] = *mdnode;
	++xqnbr;
	if (xqnbr <= jstop) {
	    adjncy[xqnbr] = 0;
	}

L1700:
	;
    }
L1800:
    return 0;

}